

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

Token __thiscall Lexer::ReadToken(Lexer *this)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  byte local_2d;
  uint yyaccept;
  uchar yych;
  Token token;
  char *start;
  char *q;
  char *p;
  Lexer *this_local;
  
  q = this->ofs_;
  while (pcVar4 = q, bVar2 = *q, pcVar6 = q, (""[(int)(uint)bVar2] & 0x20) != 0) {
    do {
      q = pcVar6;
      bVar3 = false;
      start = q + 1;
      bVar2 = q[1];
      pcVar6 = start;
    } while ((""[(int)(uint)bVar2] & 0x20) != 0);
    if (bVar2 < 0xd) {
      q = start;
      if (bVar2 == 10) goto LAB_00159a78;
LAB_00159b2d:
      yyaccept = 7;
      goto LAB_0015a2e8;
    }
    if (bVar2 < 0xe) {
      pcVar6 = q + 2;
      q = q + 2;
      if (*pcVar6 == '\n') goto LAB_00159d06;
LAB_00159d40:
      q = start;
      if (!bVar3) goto LAB_00159b2d;
      goto LAB_00159a6c;
    }
    q = start;
    if (bVar2 != 0x23) goto LAB_00159b2d;
    do {
      local_2d = q[1];
      q = q + 1;
LAB_00159d6d:
    } while ((""[(int)(uint)local_2d] & 0x80) != 0);
    if (local_2d == 0) goto LAB_00159d40;
    q = q + 1;
  }
  if (0x5e < bVar2) {
    if (bVar2 < 0x6a) {
      if (bVar2 < 99) {
        if (bVar2 == 0x60) goto LAB_00159a60;
        if (0x61 < bVar2) {
          local_2d = q[1];
          pcVar6 = q + 1;
          if (local_2d != 0x75) goto LAB_00159b81;
          local_2d = q[2];
          pcVar6 = q + 2;
          if (local_2d != 0x69) goto LAB_00159b81;
          local_2d = q[3];
          pcVar6 = q + 3;
          if (local_2d != 0x6c) goto LAB_00159b81;
          local_2d = q[4];
          pcVar6 = q + 4;
          if (local_2d != 100) goto LAB_00159b81;
          pcVar6 = q + 5;
          pbVar1 = (byte *)(q + 5);
          q = pcVar6;
          if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
            yyaccept = 1;
            goto LAB_0015a2e8;
          }
        }
      }
      else if (bVar2 == 100) {
        local_2d = q[1];
        pcVar6 = q + 1;
        if (local_2d != 0x65) goto LAB_00159b81;
        local_2d = q[2];
        pcVar6 = q + 2;
        if (local_2d != 0x66) goto LAB_00159b81;
        local_2d = q[3];
        pcVar6 = q + 3;
        if (local_2d != 0x61) goto LAB_00159b81;
        local_2d = q[4];
        pcVar6 = q + 4;
        if (local_2d != 0x75) goto LAB_00159b81;
        local_2d = q[5];
        pcVar6 = q + 5;
        if (local_2d != 0x6c) goto LAB_00159b81;
        local_2d = q[6];
        pcVar6 = q + 6;
        if (local_2d != 0x74) goto LAB_00159b81;
        pcVar6 = q + 7;
        pbVar1 = (byte *)(q + 7);
        q = pcVar6;
        if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
          yyaccept = 3;
          goto LAB_0015a2e8;
        }
      }
      else if (0x68 < bVar2) {
        local_2d = q[1];
        pcVar6 = q + 1;
        if (local_2d != 0x6e) goto LAB_00159b81;
        local_2d = q[2];
        pcVar6 = q + 2;
        if (local_2d != 99) goto LAB_00159b81;
        local_2d = q[3];
        pcVar6 = q + 3;
        if (local_2d != 0x6c) goto LAB_00159b81;
        local_2d = q[4];
        pcVar6 = q + 4;
        if (local_2d != 0x75) goto LAB_00159b81;
        local_2d = q[5];
        pcVar6 = q + 5;
        if (local_2d != 100) goto LAB_00159b81;
        local_2d = q[6];
        pcVar6 = q + 6;
        if (local_2d != 0x65) goto LAB_00159b81;
        pcVar6 = q + 7;
        pbVar1 = (byte *)(q + 7);
        q = pcVar6;
        if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
          yyaccept = 6;
          goto LAB_0015a2e8;
        }
      }
    }
    else if (bVar2 < 0x73) {
      if (bVar2 == 0x70) {
        local_2d = q[1];
        pcVar6 = q + 1;
        if (local_2d != 0x6f) goto LAB_00159b81;
        local_2d = q[2];
        pcVar6 = q + 2;
        if (local_2d != 0x6f) goto LAB_00159b81;
        local_2d = q[3];
        pcVar6 = q + 3;
        if (local_2d != 0x6c) goto LAB_00159b81;
        pcVar6 = q + 4;
        pbVar1 = (byte *)(q + 4);
        q = pcVar6;
        if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
          yyaccept = 0xc;
          goto LAB_0015a2e8;
        }
      }
      else if (0x71 < bVar2) {
        local_2d = q[1];
        pcVar6 = q + 1;
        if (local_2d != 0x75) goto LAB_00159b81;
        local_2d = q[2];
        pcVar6 = q + 2;
        if (local_2d != 0x6c) goto LAB_00159b81;
        local_2d = q[3];
        pcVar6 = q + 3;
        if (local_2d != 0x65) goto LAB_00159b81;
        pcVar6 = q + 4;
        pbVar1 = (byte *)(q + 4);
        q = pcVar6;
        if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
          yyaccept = 0xd;
          goto LAB_0015a2e8;
        }
      }
    }
    else {
      if (0x7a < bVar2) {
        if (bVar2 == 0x7c) {
          if (q[1] == '@') {
            yyaccept = 0xb;
            q = q + 2;
          }
          else if (q[1] == '|') {
            yyaccept = 10;
            q = q + 2;
          }
          else {
            yyaccept = 9;
            q = q + 1;
          }
          goto LAB_0015a2e8;
        }
        goto LAB_00159a60;
      }
      if (bVar2 < 0x74) {
        local_2d = q[1];
        pcVar6 = q + 1;
        if (local_2d != 0x75) goto LAB_00159b81;
        local_2d = q[2];
        pcVar6 = q + 2;
        if (local_2d != 0x62) goto LAB_00159b81;
        local_2d = q[3];
        pcVar6 = q + 3;
        if (local_2d != 0x6e) goto LAB_00159b81;
        local_2d = q[4];
        pcVar6 = q + 4;
        if (local_2d != 0x69) goto LAB_00159b81;
        local_2d = q[5];
        pcVar6 = q + 5;
        if (local_2d != 0x6e) goto LAB_00159b81;
        local_2d = q[6];
        pcVar6 = q + 6;
        if (local_2d != 0x6a) goto LAB_00159b81;
        local_2d = q[7];
        pcVar6 = q + 7;
        if (local_2d != 0x61) goto LAB_00159b81;
        pcVar6 = q + 8;
        pbVar1 = (byte *)(q + 8);
        q = pcVar6;
        if ((""[(int)(uint)*pbVar1] & 0x40) == 0) {
          yyaccept = 0xe;
          goto LAB_0015a2e8;
        }
      }
    }
LAB_00159b6c:
    do {
      local_2d = q[1];
      pcVar6 = q + 1;
LAB_00159b81:
      q = pcVar6;
    } while ((""[(int)(uint)local_2d] & 0x40) != 0);
    yyaccept = 5;
    goto LAB_0015a2e8;
  }
  if (bVar2 < 0x2d) {
    if (bVar2 < 0xd) {
      if (bVar2 == 0) {
        yyaccept = 0xf;
        q = q + 1;
        goto LAB_0015a2e8;
      }
      if (bVar2 == 10) {
LAB_00159a78:
        yyaccept = 8;
        q = q + 1;
        goto LAB_0015a2e8;
      }
      goto LAB_00159a60;
    }
    if (bVar2 < 0xe) {
      pcVar5 = q + 1;
      pcVar6 = q + 1;
      q = pcVar5;
      if (*pcVar6 == '\n') {
LAB_00159d06:
        yyaccept = 8;
        q = q + 1;
        goto LAB_0015a2e8;
      }
    }
    else {
      if (bVar2 != 0x23) goto LAB_00159a60;
      bVar3 = true;
      start = q + 1;
      local_2d = q[1];
      q = start;
      if (local_2d != 0) goto LAB_00159d6d;
    }
  }
  else {
    if (bVar2 < 0x3b) {
      if (bVar2 != 0x2f) {
        if (0x39 < bVar2) {
          yyaccept = 2;
          q = q + 1;
          goto LAB_0015a2e8;
        }
        goto LAB_00159b6c;
      }
    }
    else if (bVar2 < 0x3e) {
      if (0x3c < bVar2) {
        yyaccept = 4;
        q = q + 1;
        goto LAB_0015a2e8;
      }
    }
    else if ((0x40 < bVar2) && (bVar2 < 0x5b)) goto LAB_00159b6c;
LAB_00159a60:
    q = q + 1;
  }
LAB_00159a6c:
  yyaccept = 0;
LAB_0015a2e8:
  this->last_token_ = pcVar4;
  this->ofs_ = q;
  if ((yyaccept != 8) && (yyaccept != 0xf)) {
    EatWhitespace(this);
  }
  return yyaccept;
}

Assistant:

Lexer::Token Lexer::ReadToken() {
  const char* p = ofs_;
  const char* q;
  const char* start;
  Lexer::Token token;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	unsigned int yyaccept = 0;
	static const unsigned char yybm[] = {
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		160, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 192, 192, 128, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 128, 128, 128, 128, 128, 128, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 192, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
	};
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '^') {
		if (yych <= ',') {
			if (yych <= '\f') {
				if (yych <= 0x00) goto yy2;
				if (yych == '\n') goto yy6;
				goto yy4;
			} else {
				if (yych <= '\r') goto yy8;
				if (yych == '#') goto yy12;
				goto yy4;
			}
		} else {
			if (yych <= ':') {
				if (yych == '/') goto yy4;
				if (yych <= '9') goto yy13;
				goto yy16;
			} else {
				if (yych <= '=') {
					if (yych <= '<') goto yy4;
					goto yy18;
				} else {
					if (yych <= '@') goto yy4;
					if (yych <= 'Z') goto yy13;
					goto yy4;
				}
			}
		}
	} else {
		if (yych <= 'i') {
			if (yych <= 'b') {
				if (yych == '`') goto yy4;
				if (yych <= 'a') goto yy13;
				goto yy20;
			} else {
				if (yych == 'd') goto yy21;
				if (yych <= 'h') goto yy13;
				goto yy22;
			}
		} else {
			if (yych <= 'r') {
				if (yych == 'p') goto yy23;
				if (yych <= 'q') goto yy13;
				goto yy24;
			} else {
				if (yych <= 'z') {
					if (yych <= 's') goto yy25;
					goto yy13;
				} else {
					if (yych == '|') goto yy26;
					goto yy4;
				}
			}
		}
	}
yy2:
	++p;
	{ token = TEOF;     break; }
yy4:
	++p;
yy5:
	{ token = ERROR;    break; }
yy6:
	++p;
	{ token = NEWLINE;  break; }
yy8:
	yych = *++p;
	if (yych == '\n') goto yy28;
	goto yy5;
yy9:
	yyaccept = 0;
	yych = *(q = ++p);
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '\f') {
		if (yych == '\n') goto yy6;
	} else {
		if (yych <= '\r') goto yy30;
		if (yych == '#') goto yy32;
	}
yy11:
	{ token = INDENT;   break; }
yy12:
	yyaccept = 1;
	yych = *(q = ++p);
	if (yych <= 0x00) goto yy5;
	goto yy33;
yy13:
	yych = *++p;
yy14:
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = IDENT;    break; }
yy16:
	++p;
	{ token = COLON;    break; }
yy18:
	++p;
	{ token = EQUALS;   break; }
yy20:
	yych = *++p;
	if (yych == 'u') goto yy36;
	goto yy14;
yy21:
	yych = *++p;
	if (yych == 'e') goto yy37;
	goto yy14;
yy22:
	yych = *++p;
	if (yych == 'n') goto yy38;
	goto yy14;
yy23:
	yych = *++p;
	if (yych == 'o') goto yy39;
	goto yy14;
yy24:
	yych = *++p;
	if (yych == 'u') goto yy40;
	goto yy14;
yy25:
	yych = *++p;
	if (yych == 'u') goto yy41;
	goto yy14;
yy26:
	yych = *++p;
	if (yych == '@') goto yy42;
	if (yych == '|') goto yy44;
	{ token = PIPE;     break; }
yy28:
	++p;
	{ token = NEWLINE;  break; }
yy30:
	yych = *++p;
	if (yych == '\n') goto yy28;
yy31:
	p = q;
	if (yyaccept == 0) {
		goto yy11;
	} else {
		goto yy5;
	}
yy32:
	yych = *++p;
yy33:
	if (yybm[0+yych] & 128) {
		goto yy32;
	}
	if (yych <= 0x00) goto yy31;
	++p;
	{ continue; }
yy36:
	yych = *++p;
	if (yych == 'i') goto yy46;
	goto yy14;
yy37:
	yych = *++p;
	if (yych == 'f') goto yy47;
	goto yy14;
yy38:
	yych = *++p;
	if (yych == 'c') goto yy48;
	goto yy14;
yy39:
	yych = *++p;
	if (yych == 'o') goto yy49;
	goto yy14;
yy40:
	yych = *++p;
	if (yych == 'l') goto yy50;
	goto yy14;
yy41:
	yych = *++p;
	if (yych == 'b') goto yy51;
	goto yy14;
yy42:
	++p;
	{ token = PIPEAT;   break; }
yy44:
	++p;
	{ token = PIPE2;    break; }
yy46:
	yych = *++p;
	if (yych == 'l') goto yy52;
	goto yy14;
yy47:
	yych = *++p;
	if (yych == 'a') goto yy53;
	goto yy14;
yy48:
	yych = *++p;
	if (yych == 'l') goto yy54;
	goto yy14;
yy49:
	yych = *++p;
	if (yych == 'l') goto yy55;
	goto yy14;
yy50:
	yych = *++p;
	if (yych == 'e') goto yy57;
	goto yy14;
yy51:
	yych = *++p;
	if (yych == 'n') goto yy59;
	goto yy14;
yy52:
	yych = *++p;
	if (yych == 'd') goto yy60;
	goto yy14;
yy53:
	yych = *++p;
	if (yych == 'u') goto yy62;
	goto yy14;
yy54:
	yych = *++p;
	if (yych == 'u') goto yy63;
	goto yy14;
yy55:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = POOL;     break; }
yy57:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = RULE;     break; }
yy59:
	yych = *++p;
	if (yych == 'i') goto yy64;
	goto yy14;
yy60:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = BUILD;    break; }
yy62:
	yych = *++p;
	if (yych == 'l') goto yy65;
	goto yy14;
yy63:
	yych = *++p;
	if (yych == 'd') goto yy66;
	goto yy14;
yy64:
	yych = *++p;
	if (yych == 'n') goto yy67;
	goto yy14;
yy65:
	yych = *++p;
	if (yych == 't') goto yy68;
	goto yy14;
yy66:
	yych = *++p;
	if (yych == 'e') goto yy70;
	goto yy14;
yy67:
	yych = *++p;
	if (yych == 'j') goto yy72;
	goto yy14;
yy68:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = DEFAULT;  break; }
yy70:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = INCLUDE;  break; }
yy72:
	yych = *++p;
	if (yych != 'a') goto yy14;
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = SUBNINJA; break; }
}

  }

  last_token_ = start;
  ofs_ = p;
  if (token != NEWLINE && token != TEOF)
    EatWhitespace();
  return token;
}